

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O2

sftp_command * sftp_getcmd(FILE *fp,wchar_t mode,wchar_t modeflags)

{
  char cVar1;
  size_t sVar2;
  sftp_command *psVar3;
  char *__s;
  size_t sVar4;
  sftp_cmd_lookup *psVar5;
  char *pcVar6;
  char **ppcVar7;
  code *pcVar8;
  bool bVar9;
  char *pcVar10;
  char *pcVar11;
  
  psVar3 = (sftp_command *)safemalloc(1,0x20,0);
  psVar3->wordssize = 0;
  psVar3->words = (char **)0x0;
  psVar3->nwords = 0;
  if (fp == (FILE *)0x0) {
    __s = ssh_sftp_get_cmdline("psftp> ",backend == (Backend *)0x0);
  }
  else {
    if ((modeflags & 1U) != 0) {
      printf("psftp> ");
    }
    __s = fgetline(fp);
  }
  if ((__s == (char *)0x0) || (*__s == '\0')) {
    psVar3->obey = sftp_cmd_quit;
    if (mode == L'\0' || (modeflags & 1U) != 0) {
      puts("quit");
    }
    safefree(__s);
  }
  else {
    sVar4 = strcspn(__s,"\r\n");
    __s[sVar4] = '\0';
    if ((modeflags & 1U) != 0) {
      puts(__s);
    }
    for (pcVar10 = __s; (cVar1 = *pcVar10, cVar1 == '\t' || (cVar1 == ' ')); pcVar10 = pcVar10 + 1)
    {
    }
    if (cVar1 == '!') {
      psVar3->nwords = 2;
      ppcVar7 = (char **)safegrowarray(psVar3->words,&psVar3->wordssize,8,2,0,false);
      psVar3->words = ppcVar7;
      pcVar6 = dupstr("!");
      *psVar3->words = pcVar6;
      pcVar10 = dupstr(pcVar10 + 1);
      psVar3->words[1] = pcVar10;
    }
    else if (cVar1 == '#') {
      psVar3->nwords = 0;
      psVar3->wordssize = 0;
    }
    else {
      while( true ) {
        for (; (cVar1 = *pcVar10, cVar1 == '\t' || (cVar1 == ' ')); pcVar10 = pcVar10 + 1) {
        }
        if (cVar1 == '\0') break;
        bVar9 = false;
        pcVar6 = pcVar10;
        pcVar11 = pcVar10;
        while (cVar1 != '\0') {
          if (bVar9) {
            if (cVar1 != '\"') goto LAB_00111309;
LAB_00111310:
            if (pcVar11[1] == '\"') {
              pcVar11 = pcVar11 + 2;
              *pcVar6 = '\"';
              goto LAB_0011131e;
            }
            pcVar11 = pcVar11 + 1;
            bVar9 = (bool)(bVar9 ^ 1);
          }
          else {
            if (cVar1 == '\"') goto LAB_00111310;
            if ((cVar1 == '\t') || (cVar1 == ' ')) break;
LAB_00111309:
            pcVar11 = pcVar11 + 1;
            *pcVar6 = cVar1;
LAB_0011131e:
            pcVar6 = pcVar6 + 1;
          }
          cVar1 = *pcVar11;
        }
        *pcVar6 = '\0';
        ppcVar7 = (char **)safegrowarray(psVar3->words,&psVar3->wordssize,8,psVar3->nwords,1,false);
        psVar3->words = ppcVar7;
        pcVar10 = dupstr(pcVar10);
        sVar2 = psVar3->nwords;
        psVar3->nwords = sVar2 + 1;
        psVar3->words[sVar2] = pcVar10;
        pcVar10 = pcVar11 + (cVar1 != '\0');
      }
    }
    safefree(__s);
    if (psVar3->nwords == 0) {
      pcVar8 = sftp_cmd_null;
    }
    else {
      psVar5 = lookup_command(*psVar3->words);
      if (psVar5 == (sftp_cmd_lookup *)0x0) {
        pcVar8 = sftp_cmd_unknown;
      }
      else {
        pcVar8 = psVar5->obey;
      }
    }
    psVar3->obey = pcVar8;
  }
  return psVar3;
}

Assistant:

struct sftp_command *sftp_getcmd(FILE *fp, int mode, int modeflags)
{
    char *line;
    struct sftp_command *cmd;
    char *p, *q, *r;
    bool quoting;

    cmd = snew(struct sftp_command);
    cmd->words = NULL;
    cmd->nwords = 0;
    cmd->wordssize = 0;

    line = NULL;

    if (fp) {
        if (modeflags & 1)
            printf("psftp> ");
        line = fgetline(fp);
    } else {
        line = ssh_sftp_get_cmdline("psftp> ", !backend);
    }

    if (!line || !*line) {
        cmd->obey = sftp_cmd_quit;
        if ((mode == 0) || (modeflags & 1))
            printf("quit\n");
        sfree(line);
        return cmd;                    /* eof */
    }

    line[strcspn(line, "\r\n")] = '\0';

    if (modeflags & 1) {
        printf("%s\n", line);
    }

    p = line;
    while (*p && (*p == ' ' || *p == '\t'))
        p++;

    if (*p == '!') {
        /*
         * Special case: the ! command. This is always parsed as
         * exactly two words: one containing the !, and the second
         * containing everything else on the line.
         */
        cmd->nwords = 2;
        sgrowarrayn(cmd->words, cmd->wordssize, cmd->nwords, 0);
        cmd->words[0] = dupstr("!");
        cmd->words[1] = dupstr(p+1);
    } else if (*p == '#') {
        /*
         * Special case: comment. Entire line is ignored.
         */
        cmd->nwords = cmd->wordssize = 0;
    } else {

        /*
         * Parse the command line into words. The syntax is:
         *  - double quotes are removed, but cause spaces within to be
         *    treated as non-separating.
         *  - a double-doublequote pair is a literal double quote, inside
         *    _or_ outside quotes. Like this:
         *
         *      firstword "second word" "this has ""quotes"" in" and""this""
         *
         * becomes
         *
         *      >firstword<
         *      >second word<
         *      >this has "quotes" in<
         *      >and"this"<
         */
        while (1) {
            /* skip whitespace */
            while (*p && (*p == ' ' || *p == '\t'))
                p++;
            /* terminate loop */
            if (!*p)
                break;
            /* mark start of word */
            q = r = p;                 /* q sits at start, r writes word */
            quoting = false;
            while (*p) {
                if (!quoting && (*p == ' ' || *p == '\t'))
                    break;                     /* reached end of word */
                else if (*p == '"' && p[1] == '"')
                    p += 2, *r++ = '"';    /* a literal quote */
                else if (*p == '"')
                    p++, quoting = !quoting;
                else
                    *r++ = *p++;
            }
            if (*p)
                p++;                   /* skip over the whitespace */
            *r = '\0';
            sgrowarray(cmd->words, cmd->wordssize, cmd->nwords);
            cmd->words[cmd->nwords++] = dupstr(q);
        }
    }

    sfree(line);

    /*
     * Now parse the first word and assign a function.
     */

    if (cmd->nwords == 0)
        cmd->obey = sftp_cmd_null;
    else {
        const struct sftp_cmd_lookup *lookup;
        lookup = lookup_command(cmd->words[0]);
        if (!lookup)
            cmd->obey = sftp_cmd_unknown;
        else
            cmd->obey = lookup->obey;
    }

    return cmd;
}